

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  PathPtr fromPath_00;
  PathPtr path;
  PathPtr toPath_00;
  PathPtr toPath_01;
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  StringPtr fromPath_01;
  PathPtr PVar5;
  StringPtr toPath_02;
  int error;
  NullableValue<int> fromFd;
  PathPtr local_90;
  int local_7c;
  String local_78;
  int local_5c;
  String local_58;
  Function<int_(kj::StringPtr)> local_40;
  
  local_90.parts.size_ = toPath.parts.size_;
  local_90.parts.ptr = toPath.parts.ptr;
  if (local_90.parts.size_ == 0) {
    (anonymous_namespace)::DiskHandle::tryTransfer();
    return false;
  }
  if (mode == MOVE) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&local_78,fromDirectory);
    if ((char)local_78.content.ptr != '\0') {
      local_5c = local_78.content.ptr._4_4_;
      local_7c = 0;
      PathPtr::toString(&local_78,&local_90,false);
      sVar1 = local_78.content.size_;
      pcVar4 = local_78.content.ptr;
      PathPtr::toString(&local_58,&fromPath,false);
      toPath_02.content.size_ = sVar1 + (sVar1 == 0);
      if (sVar1 == 0) {
        pcVar4 = "";
      }
      pcVar3 = "";
      if (local_58.content.size_ != 0) {
        pcVar3 = local_58.content.ptr;
      }
      fromPath_01.content.size_ = local_58.content.size_ + (local_58.content.size_ == 0);
      fromPath_01.content.ptr = pcVar3;
      toPath_02.content.ptr = pcVar4;
      bVar2 = tryCommitReplacement(this,toPath_02,local_5c,fromPath_01,toMode,&local_7c);
      sVar1 = local_58.content.size_;
      pcVar4 = local_58.content.ptr;
      if (local_58.content.ptr != (char *)0x0) {
        local_58.content.ptr = (char *)0x0;
        local_58.content.size_ = 0;
        (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                  (local_58.content.disposer,pcVar4,1,sVar1,sVar1);
      }
      sVar1 = local_78.content.size_;
      pcVar4 = local_78.content.ptr;
      if (local_78.content.ptr != (char *)0x0) {
        local_78.content.ptr = (char *)0x0;
        local_78.content.size_ = 0;
        (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                  (local_78.content.disposer,pcVar4,1,sVar1,sVar1);
      }
      if (bVar2) {
        return true;
      }
      if (local_7c != 0) {
        if (local_7c == 0x12) goto LAB_0021bdc9;
        if (local_7c == 2) {
          if ((~toMode & 5) != 0) {
            return false;
          }
          if (local_90.parts.size_ == 0) {
            return false;
          }
          PVar5 = PathPtr::parent(&local_90);
          bVar2 = tryMkdir(this,PVar5,CREATE_PARENT|MODIFY|CREATE,true);
          if (bVar2) {
            toPath_00.parts.size_ = local_90.parts.size_;
            toPath_00.parts.ptr = local_90.parts.ptr;
            PVar5.parts.size_ = fromPath.parts.size_;
            PVar5.parts.ptr = fromPath.parts.ptr;
            bVar2 = tryTransfer(this,toPath_00,toMode & ~CREATE_PARENT,fromDirectory,PVar5,MOVE,self
                               );
            return bVar2;
          }
        }
        else {
          _::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                    ((Fault *)&local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x5ad,local_7c,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                     &local_90);
          _::Debug::Fault::~Fault((Fault *)&local_78);
        }
      }
      return false;
    }
  }
  else if (mode == LINK) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&local_58,fromDirectory);
    local_78.content.ptr = (char *)CONCAT71(local_78.content.ptr._1_7_,(char)local_58.content.ptr);
    if ((char)local_58.content.ptr == '\x01') {
      local_78.content.ptr = (char *)CONCAT44(local_58.content.ptr._4_4_,local_78.content.ptr._0_4_)
      ;
      path.parts.size_ = local_90.parts.size_;
      path.parts.ptr = local_90.parts.ptr;
      local_40.impl.ptr = (Iface *)operator_new(0x20);
      (local_40.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00280a30;
      local_40.impl.ptr[1]._vptr_Iface = (_func_int **)&local_78;
      local_40.impl.ptr[2]._vptr_Iface = (_func_int **)&fromPath;
      local_40.impl.ptr[3]._vptr_Iface = (_func_int **)this;
      local_40.impl.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      bVar2 = tryReplaceNode(this,path,toMode,&local_40);
      if (local_40.impl.ptr != (Iface *)0x0) {
        (**(local_40.impl.disposer)->_vptr_Disposer)
                  (local_40.impl.disposer,
                   (local_40.impl.ptr)->_vptr_Iface[-2] + (long)&(local_40.impl.ptr)->_vptr_Iface);
        return bVar2;
      }
      return bVar2;
    }
  }
LAB_0021bdc9:
  toPath_01.parts.size_ = local_90.parts.size_;
  toPath_01.parts.ptr = local_90.parts.ptr;
  fromPath_00.parts.size_ = fromPath.parts.size_;
  fromPath_00.parts.ptr = fromPath.parts.ptr;
  bVar2 = Directory::tryTransfer(self,toPath_01,toMode,fromDirectory,fromPath_00,mode);
  return bVar2;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(*fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), *fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }